

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

bool __thiscall
duckdb::TupleDataCollection::NextScanIndex
          (TupleDataCollection *this,TupleDataScanState *state,idx_t *segment_index,
          idx_t *chunk_index)

{
  pointer pTVar1;
  ulong uVar2;
  bool bVar3;
  idx_t iVar4;
  ulong uVar5;
  pointer *ppTVar6;
  
  uVar5 = state->segment_index;
  pTVar1 = (this->segments).
           super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->segments).
                 super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                 super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0xb0;
  if (uVar5 < uVar2) {
    iVar4 = state->chunk_index;
    ppTVar6 = (pointer *)
              ((long)&pTVar1[uVar5].chunks.
                      super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
              + 8);
    do {
      if (iVar4 < (ulong)(((long)*ppTVar6 - (long)((_Vector_impl_data *)(ppTVar6 + -1))->_M_start) /
                         0x28)) {
        *segment_index = uVar5;
        iVar4 = state->chunk_index;
        state->chunk_index = iVar4 + 1;
        *chunk_index = iVar4;
        iVar4 = 1;
        break;
      }
      uVar5 = uVar5 + 1;
      state->segment_index = uVar5;
      state->chunk_index = 0;
      ppTVar6 = ppTVar6 + 0x16;
      iVar4 = 0;
    } while (uVar5 < uVar2);
    bVar3 = SUB81(iVar4,0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TupleDataCollection::NextScanIndex(TupleDataScanState &state, idx_t &segment_index, idx_t &chunk_index) {
	// Check if we still have segments to scan
	if (state.segment_index >= segments.size()) {
		// No more data left in the scan
		return false;
	}
	// Check within the current segment if we still have chunks to scan
	while (state.chunk_index >= segments[state.segment_index].ChunkCount()) {
		// Exhausted all chunks for this segment: Move to the next one
		state.segment_index++;
		state.chunk_index = 0;
		if (state.segment_index >= segments.size()) {
			return false;
		}
	}
	segment_index = state.segment_index;
	chunk_index = state.chunk_index++;
	return true;
}